

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlChar * xmlXPathCastNodeSetToString(xmlNodeSetPtr ns)

{
  xmlNodePtr *ppxVar1;
  xmlChar *pxVar2;
  
  if (((ns != (xmlNodeSetPtr)0x0) && (ns->nodeNr != 0)) &&
     (ppxVar1 = ns->nodeTab, ppxVar1 != (xmlNodePtr *)0x0)) {
    if (1 < ns->nodeNr) {
      xmlXPathNodeSetSort(ns);
      ppxVar1 = ns->nodeTab;
    }
    pxVar2 = xmlNodeGetContent(*ppxVar1);
    return pxVar2;
  }
  pxVar2 = xmlStrdup("");
  return pxVar2;
}

Assistant:

xmlChar *
xmlXPathCastNodeSetToString (xmlNodeSetPtr ns) {
    if ((ns == NULL) || (ns->nodeNr == 0) || (ns->nodeTab == NULL))
	return(xmlStrdup((const xmlChar *) ""));

    if (ns->nodeNr > 1)
	xmlXPathNodeSetSort(ns);
    return(xmlXPathCastNodeToString(ns->nodeTab[0]));
}